

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::http::on_error_response_written
          (http *this,error_code *e,size_t param_3,handler *h)

{
  bool bVar1;
  callback<void_(const_std::error_code_&)> *in_RCX;
  error_code *in_RSI;
  http *in_RDI;
  error_code *in_stack_ffffffffffffffd8;
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    booster::callback<void_(const_std::error_code_&)>::operator()(in_RCX,in_stack_ffffffffffffffd8);
  }
  else {
    close(in_RDI,(int)in_RSI);
    std::error_code::error_code
              ((error_code *)&stack0xffffffffffffffd0,1,(error_category *)&cppcms_category);
    booster::callback<void_(const_std::error_code_&)>::operator()(in_RCX,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void on_error_response_written(booster::system::error_code const &e,size_t,handler const &h)
		{
			if(e) {
				h(e);
				return;
			}
			close();
			h(booster::system::error_code(errc::protocol_violation,cppcms_category));
		}